

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O1

void __thiscall obs::safe_list<obs::slot<int_(int)>_>::unref(safe_list<obs::slot<int_(int)>_> *this)

{
  atomic<int> *paVar1;
  int iVar2;
  
  LOCK();
  paVar1 = &this->m_ref;
  iVar2 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  if (iVar2 < 1) {
    __assert_fail("v >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                  ,0x166,
                  "void obs::safe_list<obs::slot<int (int)>>::unref() [T = obs::slot<int (int)>]");
  }
  if (iVar2 == 1) {
    delete_nodes(this,false);
    return;
  }
  return;
}

Assistant:

void unref() {
    int v = m_ref.fetch_sub(1);
    assert(v >= 1);
    if (v == 1)
      delete_nodes(false);
  }